

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O2

string * __thiscall
argParserAdvancedConfiguration::buildHelpLine
          (string *__return_storage_ptr__,argParserAdvancedConfiguration *this,string *argvShort,
          string *argvLong,string *help)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_60);
  if (argvShort->_M_string_length != 0) {
    std::operator+(&local_40,"     <",argvShort);
    std::operator+(&local_60,&local_40,">");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  while (__return_storage_ptr__->_M_string_length < 0x10) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (argvLong->_M_string_length != 0) {
    std::operator+(&local_40," <",argvLong);
    std::operator+(&local_60,&local_40,"> ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  while (__return_storage_ptr__->_M_string_length < 0x2d) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::operator+(&local_40," : ",help);
  std::operator+(&local_60,&local_40,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string argParserAdvancedConfiguration::buildHelpLine(const string argvShort, const string argvLong, const string help) {
    string s = "";
    if (!argvShort.empty())
        s += "     <" + argvShort + ">";
    while (s.size() < 16)
        s += " ";
    if (!argvLong.empty())
        s += " <" + argvLong + "> ";
    while (s.size() < 45)
        s += " ";
    s += " : " + help + "\n";
    return s;
}